

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::ClipperBase::DeleteFromAEL(ClipperBase *this,TEdge *e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge **ppTVar3;
  
  pTVar1 = e->NextInAEL;
  pTVar2 = e->PrevInAEL;
  if (((pTVar2 == (TEdge *)0x0) && (pTVar1 == (TEdge *)0x0)) && (this->m_ActiveEdges != e)) {
    return;
  }
  ppTVar3 = &pTVar2->NextInAEL;
  if (pTVar2 == (TEdge *)0x0) {
    ppTVar3 = &this->m_ActiveEdges;
  }
  *ppTVar3 = pTVar1;
  if (pTVar1 != (TEdge *)0x0) {
    pTVar1->PrevInAEL = pTVar2;
  }
  e->NextInAEL = (TEdge *)0x0;
  e->PrevInAEL = (TEdge *)0x0;
  return;
}

Assistant:

void ClipperBase::DeleteFromAEL(TEdge *e)
{
  TEdge* AelPrev = e->PrevInAEL;
  TEdge* AelNext = e->NextInAEL;
  if (!AelPrev &&  !AelNext && (e != m_ActiveEdges)) return; //already deleted
  if (AelPrev) AelPrev->NextInAEL = AelNext;
  else m_ActiveEdges = AelNext;
  if (AelNext) AelNext->PrevInAEL = AelPrev;
  e->NextInAEL = 0;
  e->PrevInAEL = 0;
}